

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O0

int net_would_block(mbedtls_net_context *ctx)

{
  uint uVar1;
  int *piVar2;
  mbedtls_net_context *ctx_local;
  
  uVar1 = fcntl(ctx->fd,3);
  if ((uVar1 & 0x800) == 0x800) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      ctx_local._4_4_ = 1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int net_would_block( const mbedtls_net_context *ctx )
{
    /*
     * Never return 'WOULD BLOCK' on a non-blocking socket
     */
    if( ( fcntl( ctx->fd, F_GETFL ) & O_NONBLOCK ) != O_NONBLOCK )
        return( 0 );

    switch( errno )
    {
#if defined EAGAIN
        case EAGAIN:
#endif
#if defined EWOULDBLOCK && EWOULDBLOCK != EAGAIN
        case EWOULDBLOCK:
#endif
            return( 1 );
    }
    return( 0 );
}